

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

VkImageViewType vkt::texture::util::textureTypeToImageViewType(Type type)

{
  VkImageViewType VVar1;
  
  VVar1 = VK_IMAGE_VIEW_TYPE_2D;
  if (type - TYPE_CUBE_MAP < 3) {
    VVar1 = *(VkImageViewType *)(&DAT_00b5961c + (ulong)(type - TYPE_CUBE_MAP) * 4);
  }
  return VVar1;
}

Assistant:

VkImageViewType textureTypeToImageViewType (TextureBinding::Type type)
{
	switch (type)
	{
		case TextureBinding::TYPE_2D:			return VK_IMAGE_VIEW_TYPE_2D;
		case TextureBinding::TYPE_2D_ARRAY:		return VK_IMAGE_VIEW_TYPE_2D_ARRAY;
		case TextureBinding::TYPE_CUBE_MAP:		return VK_IMAGE_VIEW_TYPE_CUBE;
		case TextureBinding::TYPE_3D:			return VK_IMAGE_VIEW_TYPE_3D;
		default:
			DE_ASSERT(false);
	}

	return VK_IMAGE_VIEW_TYPE_2D;
}